

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_base.c
# Opt level: O2

RK_S32 get_frame_fd(Avs2dHalCtx_t *p_hal,RK_S32 idx)

{
  int iVar1;
  MppBuffer mbuffer;
  
  mbuffer = (MppBuffer)0x0;
  mpp_buf_slot_get_prop(p_hal->frame_slots,idx,SLOT_BUFFER,&mbuffer);
  iVar1 = mpp_buffer_get_fd_with_caller(mbuffer,"get_frame_fd");
  return iVar1;
}

Assistant:

RK_S32 get_frame_fd(AvsdHalCtx_t *p_hal, RK_S32 idx)
{
    RK_S32 ret_fd = 0;
    MppBuffer mbuffer = NULL;

    mpp_buf_slot_get_prop(p_hal->frame_slots, idx, SLOT_BUFFER, &mbuffer);
    assert(mbuffer);
    ret_fd = mpp_buffer_get_fd(mbuffer);

    return ret_fd;
}